

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmodel.cpp
# Opt level: O3

void __thiscall
blockmodel_t::apply_mcmc_moves
          (blockmodel_t *this,vector<mcmc_move_t,_std::allocator<mcmc_move_t>_> *moves)

{
  pointer pmVar1;
  int *piVar2;
  pointer pmVar3;
  pointer piVar4;
  pointer psVar5;
  pointer puVar6;
  pointer pvVar7;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  pmVar3 = (moves->super__Vector_base<mcmc_move_t,_std::allocator<mcmc_move_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(moves->super__Vector_base<mcmc_move_t,_std::allocator<mcmc_move_t>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pmVar3;
  if (lVar8 != 0) {
    piVar4 = (this->n_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar5 = (this->adj_list_ptr_->
             super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = ((long)(this->adj_list_ptr_->
                    super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4) *
             -0x5555555555555555;
    puVar6 = (this->memberships_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      uVar11 = (ulong)pmVar3[uVar10].vertex;
      if (uVar12 < uVar11 || uVar12 - uVar11 == 0) {
LAB_0011f412:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11,uVar12);
      }
      pmVar1 = pmVar3 + uVar10;
      p_Var9 = *(_Base_ptr *)((long)&psVar5[uVar11]._M_t._M_impl + 0x18);
      pvVar7 = (this->k_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (p_Var9 != (_Rb_tree_node_base *)((long)&psVar5[uVar11]._M_t._M_impl + 8U)) {
        piVar2 = (int *)(*(long *)&pvVar7[p_Var9[1]._M_color].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (ulong)pmVar1->source * 4);
        *piVar2 = *piVar2 + -1;
        piVar2 = (int *)(*(long *)&pvVar7[p_Var9[1]._M_color].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (ulong)pmVar1->target * 4);
        *piVar2 = *piVar2 + 1;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        uVar11 = (ulong)pmVar1->vertex;
        if (uVar12 < uVar11 || uVar12 - uVar11 == 0) goto LAB_0011f412;
      }
      piVar2 = piVar4 + pmVar1->source;
      *piVar2 = *piVar2 + -1;
      piVar2 = piVar4 + pmVar1->target;
      *piVar2 = *piVar2 + 1;
      puVar6[pmVar1->vertex] = pmVar1->target;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (uVar10 < (ulong)((lVar8 >> 2) * -0x5555555555555555));
  }
  return;
}

Assistant:

void blockmodel_t::apply_mcmc_moves(std::vector<mcmc_move_t> moves)
{
  for (unsigned int i = 0; i < moves.size(); ++i)
  {
        // Change block degrees and block sizes
    for (auto neighbour = adj_list_ptr_->at(moves[i].vertex).begin();
     neighbour != adj_list_ptr_->at(moves[i].vertex).end();
     ++neighbour)
    {
      --k_[*neighbour][moves[i].source];
      ++k_[*neighbour][moves[i].target];
    }
    --n_[moves[i].source];
    ++n_[moves[i].target];
        // Set new memberships
    memberships_[moves[i].vertex] = moves[i].target;
  }
}